

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<int,_27> * __thiscall
TPZManVector<int,_27>::operator=(TPZManVector<int,_27> *this,initializer_list<int> *list)

{
  ulong uVar1;
  int *piVar2;
  size_type sVar3;
  iterator piVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  
  uVar1 = list->_M_len;
  uVar5 = (this->super_TPZVec<int>).fNAlloc;
  if ((uVar5 < uVar1) &&
     (piVar6 = (this->super_TPZVec<int>).fStore, piVar6 != this->fExtAlloc && piVar6 != (int *)0x0))
  {
    operator_delete__(piVar6);
    uVar5 = 0;
    (this->super_TPZVec<int>).fStore = (int *)0x0;
    (this->super_TPZVec<int>).fNAlloc = 0;
  }
  if (uVar1 < 0x1c) {
    piVar2 = (this->super_TPZVec<int>).fStore;
    piVar6 = this->fExtAlloc;
    if (piVar2 != (int *)0x0 && piVar2 != piVar6) {
      operator_delete__(piVar2);
    }
    (this->super_TPZVec<int>).fNAlloc = 0;
    (this->super_TPZVec<int>).fStore = piVar6;
  }
  else {
    if (uVar1 <= uVar5) {
      (this->super_TPZVec<int>).fNElements = uVar1;
      piVar6 = (this->super_TPZVec<int>).fStore;
      goto LAB_00e46fac;
    }
    piVar6 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    (this->super_TPZVec<int>).fStore = piVar6;
    (this->super_TPZVec<int>).fNAlloc = uVar1;
  }
  (this->super_TPZVec<int>).fNElements = uVar1;
LAB_00e46fac:
  sVar3 = list->_M_len;
  if (sVar3 != 0) {
    piVar4 = list->_M_array;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)piVar6 + lVar7) = *(undefined4 *)((long)piVar4 + lVar7);
      lVar7 = lVar7 + 4;
    } while (sVar3 << 2 != lVar7);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const std::initializer_list<T>& list) {
	size_t size = list.size();

	if (size > this->fNAlloc && this->fStore && this->fStore != this->fExtAlloc) {
		delete[] this->fStore;
		this->fStore = 0;
		this->fNAlloc = 0;
	}

	if (size <= NumExtAlloc) {
		if (this->fStore != fExtAlloc) {
			delete[]this->fStore;
		}
		this->fNAlloc = 0;
		this->fStore = fExtAlloc;
		this->fNElements = size;
	}
	else if (this->fNAlloc >= size) {
		this->fNElements = size;
	}
	else {
		this->fStore = new T[size];
		this->fNAlloc = size;
		this->fNElements = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;

	return *this;
}